

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

int __thiscall PP_Expression::unary_expression(PP_Expression *this)

{
  Token TVar1;
  int iVar2;
  Parser *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  Parser *this_00;
  undefined4 local_4;
  
  this_00 = in_RDI;
  TVar1 = Parser::next((Parser *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (TVar1 == PLUS) {
    local_4 = unary_expression((PP_Expression *)CONCAT44(0x3d,in_stack_ffffffffffffffe8));
  }
  else if (TVar1 == MINUS) {
    iVar2 = unary_expression((PP_Expression *)CONCAT44(0x3e,in_stack_ffffffffffffffe8));
    local_4 = -iVar2;
  }
  else if (TVar1 == PP_TILDE) {
    local_4 = unary_expression((PP_Expression *)CONCAT44(0x45,in_stack_ffffffffffffffe8));
    local_4 = local_4 ^ 0xffffffff;
  }
  else if (TVar1 == NOT) {
    iVar2 = unary_expression((PP_Expression *)CONCAT44(0x46,in_stack_ffffffffffffffe8));
    local_4 = (uint)((iVar2 != 0 ^ 0xffU) & 1);
  }
  else if (TVar1 == PP_MOC_TRUE) {
    local_4 = 1;
  }
  else if (TVar1 == PP_MOC_FALSE) {
    local_4 = 0;
  }
  else {
    Parser::prev(in_RDI);
    local_4 = primary_expression((PP_Expression *)this_00);
  }
  return local_4;
}

Assistant:

int PP_Expression::unary_expression()
{
    switch (next()) {
    case PP_PLUS:
        return unary_expression();
    case PP_MINUS:
        return -unary_expression();
    case PP_NOT:
        return !unary_expression();
    case PP_TILDE:
        return ~unary_expression();
    case PP_MOC_TRUE:
        return 1;
    case PP_MOC_FALSE:
        return 0;
    default:
        prev();
        return primary_expression();
    }
}